

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMPointsToSet.h
# Opt level: O0

bool __thiscall
dg::LLVMPointsToSet::const_iterator::operator==(const_iterator *this,const_iterator *rhs)

{
  int iVar1;
  int iVar2;
  raw_ostream *prVar3;
  raw_ostream *prVar4;
  long *in_RSI;
  long *in_RDI;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  raw_ostream *in_stack_ffffffffffffffd0;
  undefined1 local_21;
  undefined1 local_1;
  
  if (*in_RDI == 0) {
    local_1 = *in_RSI == 0;
  }
  else if (*in_RSI == 0) {
    local_1 = *in_RDI == 0;
  }
  else {
    llvm::errs();
    prVar3 = llvm::raw_ostream::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    llvm::raw_ostream::operator<<(prVar3,(void *)*in_RDI);
    prVar3 = llvm::raw_ostream::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    (**(code **)(*(long *)*in_RDI + 0x30))();
    llvm::raw_ostream::operator<<
              ((raw_ostream *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc);
    prVar4 = llvm::raw_ostream::operator<<(in_stack_ffffffffffffffd0,(char *)prVar3);
    llvm::raw_ostream::operator<<(prVar4,(void *)*in_RSI);
    prVar4 = llvm::raw_ostream::operator<<(in_stack_ffffffffffffffd0,(char *)prVar3);
    (**(code **)(*(long *)*in_RSI + 0x30))();
    llvm::raw_ostream::operator<<
              ((raw_ostream *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc);
    llvm::raw_ostream::operator<<(prVar4,(char *)prVar3);
    local_21 = false;
    if (*in_RDI == *in_RSI) {
      iVar1 = (**(code **)(*(long *)*in_RDI + 0x30))();
      iVar2 = (**(code **)(*(long *)*in_RSI + 0x30))();
      local_21 = iVar1 == iVar2;
    }
    local_1 = local_21;
  }
  return local_1;
}

Assistant:

bool operator==(const const_iterator &rhs) const {
            if (!impl)
                return !rhs.impl;
            if (!rhs.impl)
                return !impl;

            assert(!impl->end() && rhs.impl->end());
            assert(impl == rhs.impl &&
                   "Compared unrelated iterators"); // catch bugs
            llvm::errs() << "CMP" << impl << "+" << impl->position()
                         << " == " << rhs.impl << "+" << rhs.impl->position()
                         << "\n";
            return impl == rhs.impl && impl->position() == rhs.impl->position();
        }